

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_lsrpbe.c
# Opt level: O0

void lsrpbe_set_ext_params(xc_func_type *p,double *ext_params)

{
  xc_func_type *in_RSI;
  long in_RDI;
  gga_x_lsrpbe_params *params;
  double *ext_params_00;
  
  ext_params_00 = *(double **)(in_RDI + 0x178);
  set_ext_params_cpy(in_RSI,ext_params_00);
  ext_params_00[1] = ext_params_00[2] * (*ext_params_00 + 1.0) + ext_params_00[1];
  return;
}

Assistant:

static void
lsrpbe_set_ext_params(xc_func_type *p, const double *ext_params)
{
  gga_x_lsrpbe_params *params;

  assert(p != NULL && p->params != NULL);
  params = (gga_x_lsrpbe_params *) (p->params);

  set_ext_params_cpy(p, ext_params);

  /* adapt used mu value to yield wanted mu near origin (eq 9) */
  params-> mu += params->alpha*(1.0 + params->kappa);
}